

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Bac_ManWriteSig(Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  Bac_NameType_t BVar2;
  
  iVar1 = Bac_ObjIsCo(p,iObj);
  if (iVar1 != 0) {
    iObj = Bac_ObjFanin(p,iObj);
  }
  iVar1 = Bac_ObjIsCi(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                  ,0x10c,"void Bac_ManWriteSig(Bac_Ntk_t *, int)");
  }
  iVar1 = Bac_ObjGetConst(p,iObj);
  if (iVar1 != 0) {
    Bac_ManWriteConstBit(p,iObj,1);
    return;
  }
  iVar1 = Bac_ObjName(p,iObj);
  BVar2 = Bac_NameType(iVar1);
  if (BVar2 != BAC_NAME_BIN) {
    iVar1 = Bac_ManFindRealNameId(p,iObj);
    Bac_ManWriteVar(p,iVar1);
    iVar1 = Bac_ManFindRealIndex(p,iObj);
    Bac_ManWriteRange(p,iVar1,-1);
    return;
  }
  iVar1 = Abc_Lit2Var2(iVar1);
  Bac_ManWriteVar(p,iVar1);
  return;
}

Assistant:

static inline void Bac_ManWriteSig( Bac_Ntk_t * p, int iObj )
{
    if ( Bac_ObjIsCo(p, iObj) )
        iObj = Bac_ObjFanin(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
    if ( Bac_ObjGetConst(p, iObj) )
        Bac_ManWriteConstBit( p, iObj, 1 );
    else
    {
        int NameId = Bac_ObjName(p, iObj);
        if ( Bac_NameType(NameId) == BAC_NAME_BIN )
            Bac_ManWriteVar( p, Abc_Lit2Var2(NameId) );
        else
        {
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, iObj) );
            Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, iObj), -1 );
        }
    }
}